

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v8::detail::
get_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>>
          (format_arg *__return_storage_ptr__,detail *this,
          basic_format_context<fmt::v8::appender,_char> *ctx,basic_string_view<char> id)

{
  basic_string_view<char> name;
  bool bVar1;
  format_arg *arg;
  basic_format_context<fmt::v8::appender,_char> *ctx_local;
  basic_string_view<char> id_local;
  
  name.size_ = (size_t)id.data_;
  name.data_ = (char *)ctx;
  basic_format_context<fmt::v8::appender,_char>::arg
            (__return_storage_ptr__,(basic_format_context<fmt::v8::appender,_char> *)this,name);
  bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)__return_storage_ptr__);
  if (!bVar1) {
    basic_format_context<fmt::v8::appender,_char>::on_error
              ((basic_format_context<fmt::v8::appender,_char> *)this,"argument not found");
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto get_arg(Context& ctx, ID id) ->
    typename Context::format_arg {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument not found");
  return arg;
}